

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

void __thiscall crnlib::dxt_image::flip_row(dxt_image *this,uint y)

{
  element_type eVar1;
  element *peVar2;
  dxt3_block *pdVar3;
  dxt3_block *pdVar4;
  uint bit_ofs;
  uint value;
  uint value_00;
  ulong uVar5;
  uint8 *puVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  undefined8 uVar10;
  uint bit_ofs_1;
  long lVar11;
  uint uVar12;
  uint y_2;
  uint y_00;
  uint8 *puVar13;
  long lVar14;
  int iVar15;
  uint y_1;
  int iVar16;
  int iVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint x;
  uint x_00;
  uint uVar22;
  dxt3_block *this_00;
  element tmp [2];
  dxt3_block local_68;
  dxt3_block local_60;
  int local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  dxt_image *local_40;
  ulong local_38;
  
  uVar20 = this->m_blocks_x;
  if (uVar20 != 0) {
    iVar16 = ~y + this->m_blocks_y;
    local_48 = 0;
    local_40 = this;
    local_50 = y;
    local_54 = iVar16;
    uVar21 = this->m_num_elements_per_block;
    do {
      uVar5 = (ulong)uVar21;
      uVar22 = 0;
      if (uVar21 != 0) {
        local_38 = 0;
        do {
          peVar2 = this->m_pElements;
          local_68.m_alpha =
               *&peVar2[(this->m_blocks_x * y + (int)local_48) * (int)uVar5 + (int)local_38].m_bytes
          ;
          local_60.m_alpha =
               *&peVar2[(this->m_blocks_x * iVar16 + (int)local_48) * (int)uVar5 + (int)local_38].
                 m_bytes;
          uVar10 = CONCAT71((int7)((ulong)peVar2 >> 8),1);
          pdVar3 = &local_68;
          pdVar4 = &local_68;
          this_00 = &local_68;
          do {
            puVar13 = pdVar3->m_alpha + 2;
            puVar6 = pdVar4->m_alpha + 4;
            local_4c = (uint)uVar10;
            eVar1 = this->m_element_type[local_38];
            if (eVar1 == cColorDXT1) {
              lVar11 = 0;
              do {
                lVar14 = 3 - lVar11;
                bVar7 = puVar6[lVar14];
                iVar16 = 0;
                do {
                  bVar8 = puVar6[lVar11];
                  bVar9 = (byte)iVar16;
                  bVar18 = ~(byte)(3 << (bVar9 & 0x1f));
                  puVar6[lVar11] =
                       (byte)((bVar7 >> (bVar9 & 0x1f) & 3) << (bVar9 & 0x1f)) | bVar8 & bVar18;
                  bVar7 = (byte)((bVar8 >> (bVar9 & 0x1f) & 3) << (bVar9 & 0x1f)) |
                          bVar18 & puVar6[lVar14];
                  puVar6[lVar14] = bVar7;
                  iVar16 = iVar16 + 2;
                } while (iVar16 != 8);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 2);
            }
            else if (eVar1 == cAlphaDXT3) {
              y_00 = 0;
              do {
                x_00 = 0;
                do {
                  value = dxt3_block::get_alpha(this_00,x_00,y_00,false);
                  value_00 = dxt3_block::get_alpha(this_00,x_00,3 - y_00,false);
                  dxt3_block::set_alpha(this_00,x_00,y_00,value_00,false);
                  dxt3_block::set_alpha(this_00,x_00,3 - y_00,value,false);
                  x_00 = x_00 + 1;
                } while (x_00 != 4);
                y_00 = y_00 + 1;
              } while (y_00 != 2);
            }
            else if (eVar1 == cAlphaDXT5) {
              iVar16 = 0x24;
              iVar15 = 0;
              iVar17 = 0;
              do {
                iVar19 = 0;
                do {
                  uVar20 = (uint)(iVar15 + iVar19) >> 3;
                  bVar7 = (byte)(iVar15 + iVar19) & 7;
                  uVar22 = iVar16 + iVar19;
                  uVar5 = (ulong)(uVar22 >> 3);
                  uVar21 = (uint)puVar13[uVar5];
                  if (uVar22 < 0x28) {
                    uVar21 = (uint)CONCAT11(puVar13[uVar5 + 1],puVar13[uVar5]);
                  }
                  bVar8 = (byte)uVar22 & 7;
                  uVar12 = (ushort)(CONCAT11((pdVar3->m_alpha + 3)[uVar20],puVar13[uVar20]) >> bVar7
                                   ) & 7;
                  *(ushort *)(puVar13 + uVar20) =
                       (ushort)((uVar21 >> bVar8 & 7) << bVar7) |
                       ~(ushort)(7 << bVar7) &
                       CONCAT11((pdVar3->m_alpha + 3)[uVar20],puVar13[uVar20]);
                  if (uVar22 < 0x28) {
                    uVar20 = uVar12 << bVar8 |
                             ~(7 << bVar8) & (uint)CONCAT11(puVar13[uVar5 + 1],puVar13[uVar5]);
                    puVar13[uVar5 + 1] = (uint8)(uVar20 >> 8);
                  }
                  else {
                    uVar20 = uVar12 << bVar8 | (uint)puVar13[uVar5] & ~(7 << bVar8);
                  }
                  puVar13[uVar5] = (uint8)uVar20;
                  iVar19 = iVar19 + 3;
                } while (iVar19 != 0xc);
                iVar17 = iVar17 + 1;
                iVar16 = iVar16 + -0xc;
                iVar15 = iVar15 + 0xc;
              } while (iVar17 != 2);
            }
            this_00 = &local_60;
            pdVar3 = &local_60;
            pdVar4 = &local_60;
            uVar10 = 0;
            this = local_40;
          } while ((local_4c & 1) != 0);
          *&local_40->m_pElements
            [(local_40->m_blocks_x * local_50 + (int)local_48) * local_40->m_num_elements_per_block
             + (int)local_38].m_bytes = local_60.m_alpha;
          *&local_40->m_pElements
            [(local_40->m_blocks_x * local_54 + (int)local_48) * local_40->m_num_elements_per_block
             + (int)local_38].m_bytes = local_68.m_alpha;
          local_38 = local_38 + 1;
          uVar22 = local_40->m_num_elements_per_block;
          uVar5 = (ulong)uVar22;
          y = local_50;
          iVar16 = local_54;
        } while (local_38 < uVar5);
        uVar20 = local_40->m_blocks_x;
      }
      uVar12 = (int)local_48 + 1;
      local_48 = (ulong)uVar12;
      uVar21 = uVar22;
    } while (uVar12 < uVar20);
  }
  return;
}

Assistant:

void dxt_image::flip_row(uint y)
    {
        const uint other_y = (m_blocks_y - 1) - y;
        for (uint x = 0; x < m_blocks_x; x++)
        {
            for (uint e = 0; e < get_elements_per_block(); e++)
            {
                element tmp[2] = { get_element(x, y, e), get_element(x, other_y, e) };

                for (uint i = 0; i < 2; i++)
                {
                    switch (get_element_type(e))
                    {
                    case cColorDXT1:
                        reinterpret_cast<dxt1_block*>(&tmp[i])->flip_y();
                        break;
                    case cAlphaDXT3:
                        reinterpret_cast<dxt3_block*>(&tmp[i])->flip_y();
                        break;
                    case cAlphaDXT5:
                        reinterpret_cast<dxt5_block*>(&tmp[i])->flip_y();
                        break;
                    default:
                        CRNLIB_ASSERT(0);
                        break;
                    }
                }

                get_element(x, y, e) = tmp[1];
                get_element(x, other_y, e) = tmp[0];
            }
        }
    }